

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipkincore_types.cpp
# Opt level: O0

ssize_t __thiscall
twitter::zipkin::thrift::Span::read(Span *this,int __fd,void *__buf,size_t __nbytes)

{
  uint32_t uVar1;
  int iVar2;
  uint uVar3;
  reference pvVar4;
  reference pvVar5;
  undefined4 in_register_00000034;
  uint local_74;
  TType local_70;
  uint32_t _i16;
  TType _etype15;
  uint32_t _size12;
  uint32_t _i11;
  TType _etype10;
  uint32_t _size7;
  int16_t local_4e;
  TType local_4c;
  undefined1 local_48 [2];
  int16_t fid;
  TType ftype;
  string fname;
  uint32_t xfer;
  TInputRecursionTracker tracker;
  TProtocol *iprot_local;
  Span *this_local;
  
  tracker.prot_ = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  apache::thrift::protocol::TInputRecursionTracker::TInputRecursionTracker
            ((TInputRecursionTracker *)&stack0xffffffffffffffe0,tracker.prot_);
  fname.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)local_48);
  uVar1 = apache::thrift::protocol::TProtocol::readStructBegin(tracker.prot_,(string *)local_48);
  fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
  while( true ) {
    uVar1 = apache::thrift::protocol::TProtocol::readFieldBegin
                      (tracker.prot_,(string *)local_48,&local_4c,&local_4e);
    fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
    if (local_4c == T_STOP) break;
    switch(local_4e) {
    case 1:
      if (local_4c == T_I64) {
        uVar1 = apache::thrift::protocol::TProtocol::readI64(tracker.prot_,&this->trace_id);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
        this->__isset = (_Span__isset)((ushort)this->__isset & 0xfffe | 1);
      }
      else {
        uVar1 = apache::thrift::protocol::TProtocol::skip(tracker.prot_,local_4c);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
      }
      break;
    default:
      uVar1 = apache::thrift::protocol::TProtocol::skip(tracker.prot_,local_4c);
      fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
      break;
    case 3:
      if (local_4c == T_STRING) {
        uVar1 = apache::thrift::protocol::TProtocol::readString(tracker.prot_,&this->name);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
        this->__isset = (_Span__isset)((ushort)this->__isset & 0xfffd | 2);
      }
      else {
        uVar1 = apache::thrift::protocol::TProtocol::skip(tracker.prot_,local_4c);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
      }
      break;
    case 4:
      if (local_4c == T_I64) {
        uVar1 = apache::thrift::protocol::TProtocol::readI64(tracker.prot_,&this->id);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
        this->__isset = (_Span__isset)((ushort)this->__isset & 0xfffb | 4);
      }
      else {
        uVar1 = apache::thrift::protocol::TProtocol::skip(tracker.prot_,local_4c);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
      }
      break;
    case 5:
      if (local_4c == T_I64) {
        uVar1 = apache::thrift::protocol::TProtocol::readI64(tracker.prot_,&this->parent_id);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
        this->__isset = (_Span__isset)((ushort)this->__isset & 0xfff7 | 8);
      }
      else {
        uVar1 = apache::thrift::protocol::TProtocol::skip(tracker.prot_,local_4c);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
      }
      break;
    case 6:
      if (local_4c == T_LIST) {
        std::
        vector<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
        ::clear(&this->annotations);
        uVar1 = apache::thrift::protocol::TProtocol::readListBegin(tracker.prot_,&_size12,&_i11);
        fname.field_2._12_4_ = fname.field_2._12_4_ + uVar1;
        std::
        vector<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
        ::resize(&this->annotations,(ulong)_i11);
        for (_etype15 = T_STOP; _etype15 < _i11; _etype15 = _etype15 + T_VOID) {
          pvVar4 = std::
                   vector<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
                   ::operator[](&this->annotations,(ulong)_etype15);
          iVar2 = (**(code **)(*(long *)pvVar4 + 0x10))(pvVar4,tracker.prot_);
          fname.field_2._12_4_ = iVar2 + fname.field_2._12_4_;
        }
        uVar1 = apache::thrift::protocol::TProtocol::readListEnd(tracker.prot_);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
        this->__isset = (_Span__isset)((ushort)this->__isset & 0xffef | 0x10);
      }
      else {
        uVar1 = apache::thrift::protocol::TProtocol::skip(tracker.prot_,local_4c);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
      }
      break;
    case 8:
      if (local_4c == T_LIST) {
        std::
        vector<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
        ::clear(&this->binary_annotations);
        uVar1 = apache::thrift::protocol::TProtocol::readListBegin(tracker.prot_,&local_70,&_i16);
        fname.field_2._12_4_ = fname.field_2._12_4_ + uVar1;
        std::
        vector<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
        ::resize(&this->binary_annotations,(ulong)_i16);
        for (local_74 = 0; local_74 < _i16; local_74 = local_74 + 1) {
          pvVar5 = std::
                   vector<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
                   ::operator[](&this->binary_annotations,(ulong)local_74);
          iVar2 = (**(code **)(*(long *)pvVar5 + 0x10))(pvVar5,tracker.prot_);
          fname.field_2._12_4_ = iVar2 + fname.field_2._12_4_;
        }
        uVar1 = apache::thrift::protocol::TProtocol::readListEnd(tracker.prot_);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
        this->__isset = (_Span__isset)((ushort)this->__isset & 0xffdf | 0x20);
      }
      else {
        uVar1 = apache::thrift::protocol::TProtocol::skip(tracker.prot_,local_4c);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
      }
      break;
    case 9:
      if (local_4c == T_BOOL) {
        uVar1 = apache::thrift::protocol::TProtocol::readBool(tracker.prot_,&this->debug);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
        this->__isset = (_Span__isset)((ushort)this->__isset & 0xffbf | 0x40);
      }
      else {
        uVar1 = apache::thrift::protocol::TProtocol::skip(tracker.prot_,local_4c);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
      }
      break;
    case 10:
      if (local_4c == T_I64) {
        uVar1 = apache::thrift::protocol::TProtocol::readI64(tracker.prot_,&this->timestamp);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
        this->__isset = (_Span__isset)((ushort)this->__isset & 0xff7f | 0x80);
      }
      else {
        uVar1 = apache::thrift::protocol::TProtocol::skip(tracker.prot_,local_4c);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
      }
      break;
    case 0xb:
      if (local_4c == T_I64) {
        uVar1 = apache::thrift::protocol::TProtocol::readI64(tracker.prot_,&this->duration);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
        this->__isset = (_Span__isset)((ushort)this->__isset & 0xfeff | 0x100);
      }
      else {
        uVar1 = apache::thrift::protocol::TProtocol::skip(tracker.prot_,local_4c);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
      }
      break;
    case 0xc:
      if (local_4c == T_I64) {
        uVar1 = apache::thrift::protocol::TProtocol::readI64(tracker.prot_,&this->trace_id_high);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
        this->__isset = (_Span__isset)((ushort)this->__isset & 0xfdff | 0x200);
      }
      else {
        uVar1 = apache::thrift::protocol::TProtocol::skip(tracker.prot_,local_4c);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
      }
    }
    uVar1 = apache::thrift::protocol::TProtocol::readFieldEnd(tracker.prot_);
    fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
  }
  uVar1 = apache::thrift::protocol::TProtocol::readStructEnd(tracker.prot_);
  uVar3 = uVar1 + fname.field_2._12_4_;
  fname.field_2._12_4_ = uVar3;
  std::__cxx11::string::~string((string *)local_48);
  apache::thrift::protocol::TInputRecursionTracker::~TInputRecursionTracker
            ((TInputRecursionTracker *)&stack0xffffffffffffffe0);
  return (ulong)uVar3;
}

Assistant:

uint32_t Span::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;


  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->trace_id);
          this->__isset.trace_id = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readString(this->name);
          this->__isset.name = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 4:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->id);
          this->__isset.id = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 5:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->parent_id);
          this->__isset.parent_id = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 6:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->annotations.clear();
            uint32_t _size7;
            ::apache::thrift::protocol::TType _etype10;
            xfer += iprot->readListBegin(_etype10, _size7);
            this->annotations.resize(_size7);
            uint32_t _i11;
            for (_i11 = 0; _i11 < _size7; ++_i11)
            {
              xfer += this->annotations[_i11].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.annotations = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 8:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->binary_annotations.clear();
            uint32_t _size12;
            ::apache::thrift::protocol::TType _etype15;
            xfer += iprot->readListBegin(_etype15, _size12);
            this->binary_annotations.resize(_size12);
            uint32_t _i16;
            for (_i16 = 0; _i16 < _size12; ++_i16)
            {
              xfer += this->binary_annotations[_i16].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.binary_annotations = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 9:
        if (ftype == ::apache::thrift::protocol::T_BOOL) {
          xfer += iprot->readBool(this->debug);
          this->__isset.debug = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 10:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->timestamp);
          this->__isset.timestamp = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 11:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->duration);
          this->__isset.duration = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 12:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->trace_id_high);
          this->__isset.trace_id_high = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  return xfer;
}